

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

void __thiscall SimpleLogger::LoggerStream::LoggerStream(LoggerStream *this)

{
  std::ios_base::ios_base((ios_base *)&this->field_0x220);
  *(undefined8 *)&this->field_0x2f8 = 0;
  *(undefined2 *)&this->field_0x300 = 0;
  *(undefined8 *)&this->field_0x308 = 0;
  *(undefined8 *)&this->field_0x310 = 0;
  *(undefined8 *)&this->field_0x318 = 0;
  *(undefined8 *)&this->field_0x320 = 0;
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x1ce438;
  *(undefined8 *)&this->field_0x220 = 0x1ce460;
  std::ios::init((streambuf *)&this->field_0x220);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x1ce3e8;
  *(undefined8 *)&this->field_0x220 = 0x1ce410;
  *(code **)&(this->super_ostream).field_0x8 = std::__throw_system_error;
  *(undefined8 *)&(this->super_ostream).field_0x10 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x18 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x20 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x28 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x30 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x38 = 0;
  std::locale::locale((locale *)&(this->super_ostream).field_0x40);
  *(code **)&(this->super_ostream).field_0x8 = std::locale::locale;
  *(undefined4 *)&(this->super_ostream).field_0x48 = 0x18;
  *(undefined1 **)&(this->super_ostream).field_0x50 = &(this->super_ostream).field_0x60;
  *(undefined8 *)&(this->super_ostream).field_0x58 = 0;
  (this->super_ostream).field_0x60 = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&(this->super_ostream).field_0x70);
  this->level = 0;
  this->logger = (SimpleLogger *)0x0;
  this->file = (char *)0x0;
  this->func = (char *)0x0;
  this->line = 0;
  return;
}

Assistant:

LoggerStream() : std::ostream(&buf), level(0), logger(nullptr)
                       , file(nullptr), func(nullptr), line(0) {}